

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O2

shared_ptr<JSONHandler> make_all_handler(void)

{
  _Head_base<0UL,_JSONHandler::Members_*,_false> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<JSONHandler> sVar3;
  shared_ptr<JSONHandler> h5;
  shared_ptr<JSONHandler> h6;
  shared_ptr<JSONHandler> h6ab;
  shared_ptr<JSONHandler> h6a;
  shared_ptr<JSONHandler> h4;
  shared_ptr<JSONHandler> h6ax;
  shared_ptr<JSONHandler> h5s;
  shared_ptr<JSONHandler> h3;
  shared_ptr<JSONHandler> h2;
  shared_ptr<JSONHandler> h1;
  allocator<char> local_461;
  string local_460;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_440;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_430;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_420;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_3e0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_3d0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_3c0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_3b0;
  json_handler_t local_3a0;
  json_handler_t local_380;
  json_handler_t local_360;
  json_handler_t local_340;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_320;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_300;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_2e0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_2a0;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_290;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_280;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_260;
  string local_250;
  void_handler_t local_230;
  string local_210;
  void_handler_t local_1f0;
  string local_1d0;
  void_handler_t local_1b0;
  string local_190;
  void_handler_t local_170;
  string_handler_t local_150;
  json_handler_t local_130;
  void_handler_t local_110;
  string_handler_t local_f0;
  bool_handler_t local_d0;
  json_handler_t local_b0;
  bool_handler_t local_90;
  string_handler_t local_70;
  string_handler_t local_50;
  
  std::make_shared<JSONHandler>();
  local_340.super__Function_base._M_functor._8_8_ = 0;
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  local_340.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_340._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_340.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"dict end",(allocator<char> *)&local_460);
  make_print_message(&local_170,&local_190);
  JSONHandler::addDictHandlers((JSONHandler *)_Var1._M_head_impl,&local_340,&local_170);
  std::_Function_base::~_Function_base(&local_170.super__Function_base);
  std::__cxx11::string::~string((string *)&local_190);
  std::_Function_base::~_Function_base(&local_340.super__Function_base);
  std::make_shared<JSONHandler>();
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_50._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_3b0._M_ptr,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"one",(allocator<char> *)&local_3c0);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_260,&local_3b0);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  std::make_shared<JSONHandler>();
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70.super__Function_base._M_functor._M_unused._M_object = print_number;
  local_70._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_70.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addNumberHandler(local_3c0._M_ptr,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"two",(allocator<char> *)&local_3d0);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_270,&local_3c0);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_270);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  std::make_shared<JSONHandler>();
  local_90.super__Function_base._M_functor._8_8_ = 0;
  local_90.super__Function_base._M_functor._M_unused._M_object = print_bool;
  local_90._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_invoke;
  local_90.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_manager;
  JSONHandler::addBoolHandler(local_3d0._M_ptr,&local_90);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"three",(allocator<char> *)&local_400);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_280,&local_3d0);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_280);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  std::make_shared<JSONHandler>();
  local_b0.super__Function_base._M_functor._8_8_ = 0;
  local_b0.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_b0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_b0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  JSONHandler::addAnyHandler(local_400._M_ptr,&local_b0);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"four",(allocator<char> *)&local_440);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_290,&local_400);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_290);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"phour",(allocator<char> *)&local_440);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2a0,&local_400);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_2a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  std::make_shared<JSONHandler>();
  local_d0.super__Function_base._M_functor._8_8_ = 0;
  local_d0.super__Function_base._M_functor._M_unused._M_object = print_bool;
  local_d0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_invoke;
  local_d0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_manager;
  JSONHandler::addBoolHandler(local_440._M_ptr,&local_d0);
  std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  local_f0.super__Function_base._M_functor._8_8_ = 0;
  local_f0.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_f0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_f0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_440._M_ptr,&local_f0);
  std::_Function_base::~_Function_base(&local_f0.super__Function_base);
  local_110.super__Function_base._M_functor._8_8_ = 0;
  local_110.super__Function_base._M_functor._M_unused._M_object = print_null;
  local_110._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_110.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addNullHandler(local_440._M_ptr,&local_110);
  std::_Function_base::~_Function_base(&local_110.super__Function_base);
  std::make_shared<JSONHandler>();
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"five",(allocator<char> *)&local_430);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2b0,&local_3e0);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_2b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  peVar2 = local_3e0._M_ptr;
  local_360.super__Function_base._M_functor._8_8_ = 0;
  local_360.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_360._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_360.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"array end",(allocator<char> *)&local_460);
  make_print_message(&local_1b0,&local_1d0);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2c0,&local_440);
  JSONHandler::addArrayHandlers(peVar2,&local_360,&local_1b0,(shared_ptr<JSONHandler> *)&local_2c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
  std::_Function_base::~_Function_base(&local_1b0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::_Function_base::~_Function_base(&local_360.super__Function_base);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2d0,&local_440);
  JSONHandler::addFallbackHandler(local_3e0._M_ptr,(shared_ptr<JSONHandler> *)&local_2d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount);
  std::make_shared<JSONHandler>();
  peVar2 = local_430._M_ptr;
  local_380.super__Function_base._M_functor._8_8_ = 0;
  local_380.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_380._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_380.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"dict end",(allocator<char> *)&local_460);
  make_print_message(&local_1f0,&local_210);
  JSONHandler::addDictHandlers(peVar2,&local_380,&local_1f0);
  std::_Function_base::~_Function_base(&local_1f0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_210);
  std::_Function_base::~_Function_base(&local_380.super__Function_base);
  std::make_shared<JSONHandler>();
  peVar2 = local_430._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"a",(allocator<char> *)&local_420);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2e0,&local_410);
  JSONHandler::addDictKeyHandler(peVar2,&local_460,(shared_ptr<JSONHandler> *)&local_2e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  peVar2 = local_410._M_ptr;
  local_3a0.super__Function_base._M_functor._8_8_ = 0;
  local_3a0.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_3a0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_3a0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"dict end",(allocator<char> *)&local_460);
  make_print_message(&local_230,&local_250);
  JSONHandler::addDictHandlers(peVar2,&local_3a0,&local_230);
  std::_Function_base::~_Function_base(&local_230.super__Function_base);
  std::__cxx11::string::~string((string *)&local_250);
  std::_Function_base::~_Function_base(&local_3a0.super__Function_base);
  std::make_shared<JSONHandler>();
  peVar2 = local_410._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"b",(allocator<char> *)&local_3f0);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2f0,&local_420);
  JSONHandler::addDictKeyHandler(peVar2,&local_460,(shared_ptr<JSONHandler> *)&local_2f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  std::make_shared<JSONHandler>();
  local_130.super__Function_base._M_functor._8_8_ = 0;
  local_130.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_130._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_130.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  JSONHandler::addAnyHandler(local_3f0._M_ptr,&local_130);
  std::_Function_base::~_Function_base(&local_130.super__Function_base);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_300,&local_3f0);
  JSONHandler::addFallbackDictHandler(local_410._M_ptr,(shared_ptr<JSONHandler> *)&local_300);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_300._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"b",&local_461);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_310,&local_420);
  JSONHandler::addDictKeyHandler(local_430._M_ptr,&local_460,(shared_ptr<JSONHandler> *)&local_310);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_310._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  local_150.super__Function_base._M_functor._8_8_ = 0;
  local_150.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_150._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_150.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_420._M_ptr,&local_150);
  std::_Function_base::~_Function_base(&local_150.super__Function_base);
  _Var1._M_head_impl =
       (in_RDI->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"six",&local_461);
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_320,&local_430);
  JSONHandler::addDictKeyHandler
            ((JSONHandler *)_Var1._M_head_impl,&local_460,(shared_ptr<JSONHandler> *)&local_320);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_320._M_refcount);
  std::__cxx11::string::~string((string *)&local_460);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0._M_refcount);
  sVar3.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<JSONHandler>)sVar3.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<JSONHandler>
make_all_handler()
{
    auto h = std::make_shared<JSONHandler>();
    h->addDictHandlers(print_json, make_print_message("dict end"));
    auto h1 = std::make_shared<JSONHandler>();
    h1->addStringHandler(print_string);
    h->addDictKeyHandler("one", h1);
    auto h2 = std::make_shared<JSONHandler>();
    h2->addNumberHandler(print_number);
    h->addDictKeyHandler("two", h2);
    auto h3 = std::make_shared<JSONHandler>();
    h3->addBoolHandler(print_bool);
    h->addDictKeyHandler("three", h3);
    auto h4 = std::make_shared<JSONHandler>();
    h4->addAnyHandler(print_json);
    h->addDictKeyHandler("four", h4);
    h->addDictKeyHandler("phour", h4); // share h4
    auto h5 = std::make_shared<JSONHandler>();
    // Allow to be either string or bool
    h5->addBoolHandler(print_bool);
    h5->addStringHandler(print_string);
    h5->addNullHandler(print_null);
    auto h5s = std::make_shared<JSONHandler>();
    h->addDictKeyHandler("five", h5s);
    h5s->addArrayHandlers(print_json, make_print_message("array end"), h5);
    h5s->addFallbackHandler(h5);
    auto h6 = std::make_shared<JSONHandler>();
    h6->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6a = std::make_shared<JSONHandler>();
    h6->addDictKeyHandler("a", h6a);
    h6a->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6ab = std::make_shared<JSONHandler>();
    h6a->addDictKeyHandler("b", h6ab);
    auto h6ax = std::make_shared<JSONHandler>();
    h6ax->addAnyHandler(print_json);
    h6a->addFallbackDictHandler(h6ax);
    h6->addDictKeyHandler("b", h6ab); // share
    h6ab->addStringHandler(print_string);
    h->addDictKeyHandler("six", h6);
    return h;
}